

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_image_extract_palette_to_buffer(rf_image image,rf_color *palette_dst,rf_int palette_size)

{
  rf_color *prVar1;
  rf_source_location source_location;
  int iVar2;
  uint uVar3;
  rf_color rVar4;
  long lVar5;
  long lVar6;
  rf_int palette_iter;
  long lVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  rf_int img_iter;
  long lVar8;
  long in_FS_OFFSET;
  
  if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
    if (palette_size < 1) {
      rf_log_impl(4,0x172c2a);
    }
    else {
      iVar2 = rf_pixel_buffer_size(image.width,image.height,image.format);
      uVar3 = rf_bytes_per_pixel(image.format);
      lVar7 = 0;
      lVar8 = 0;
      while ((lVar8 < iVar2 && (lVar7 < palette_size))) {
        rVar4 = rf_format_one_pixel_to_rgba32(image.data,image.format);
        lVar5 = 0;
        if (0 < lVar7) {
          lVar5 = lVar7;
        }
        lVar6 = 0;
        do {
          if (lVar5 == lVar6) {
            palette_dst[lVar7] = rVar4;
            lVar7 = lVar7 + 1;
            break;
          }
          prVar1 = palette_dst + lVar6;
          lVar6 = lVar6 + 1;
        } while (*prVar1 != rVar4);
        lVar8 = lVar8 + (ulong)uVar3;
      }
    }
  }
  else {
    source_location.proc_name._0_4_ = 0x172c07;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x3bff;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Function only works for uncompressed formats but was called with format %d.",1,
                (ulong)image.format,in_R8,in_R9);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_extract_palette_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3bff;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  }
  return;
}

Assistant:

RF_API void rf_image_extract_palette_to_buffer(rf_image image, rf_color* palette_dst, rf_int palette_size)
{
    if (rf_is_uncompressed_format(image.format))
    {
        if (palette_size > 0)
        {
            int img_size = rf_image_size(image);
            int img_bpp  = rf_bytes_per_pixel(image.format);
            const unsigned char* img_data = (unsigned char*) image.data;

            for (rf_int img_iter = 0, palette_iter = 0; img_iter < img_size && palette_iter < palette_size; img_iter += img_bpp)
            {
                rf_color color = rf_format_one_pixel_to_rgba32(img_data, image.format);

                bool color_found = false;

                for (rf_int i = 0; i < palette_iter; i++)
                {
                    if (rf_color_match(palette_dst[i], color))
                    {
                        color_found = true;
                        break;
                    }
                }

                if (!color_found)
                {
                    palette_dst[palette_iter] = color;
                    palette_iter++;
                }
            }
        }
        else RF_LOG(RF_LOG_TYPE_WARNING, "Palette size was 0.");
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);
}